

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack13_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1fff;
  out[1] = *in >> 0xd & 0x1fff;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x1a;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x7f) << 6 | *puVar1;
  out[3] = *puVar2 >> 7 & 0x1fff;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x14;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 1) << 0xc | *puVar1;
  out[5] = *puVar2 >> 1 & 0x1fff;
  out[6] = *puVar2 >> 0xe & 0x1fff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1b;
  *puVar1 = (in[3] & 0xff) << 5 | *puVar1;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack13_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 13);
  out++;
  *out = ((*in) >> 13) % (1U << 13);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 7)) << (13 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 13);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 1)) << (13 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 13);
  out++;
  *out = ((*in) >> 14) % (1U << 13);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 8)) << (13 - 8);
  out++;

  return in + 1;
}